

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

array<unsigned_char,_4UL> PacketProcessor::ENumber(uint number,size_t *size)

{
  ulong uVar1;
  char cVar2;
  array<unsigned_char,_4UL> aVar3;
  reference pvVar6;
  int local_20;
  int i;
  uint onumber;
  size_t *size_local;
  uint number_local;
  array<unsigned_char,_4UL> bytes;
  array<unsigned_char,_4UL> aVar4;
  array<unsigned_char,_4UL> aVar5;
  
  size_local._4_1_ = 0xfe;
  size_local._5_1_ = 0xfe;
  size_local._6_1_ = 0xfe;
  size_local._7_1_ = 0xfe;
  size_local._0_4_ = number;
  if (0xf71ae4 < number) {
    pvVar6 = std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)((long)&size_local + 4),3);
    *pvVar6 = (char)((ulong)number / 0xf71ae5) + '\x01';
    size_local._0_4_ = (uint)size_local % 0xf71ae5;
  }
  if (0xfa08 < number) {
    uVar1 = (ulong)(uint)size_local;
    pvVar6 = std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)((long)&size_local + 4),2);
    *pvVar6 = (char)(uVar1 / 0xfa09) + '\x01';
    size_local._0_4_ = (uint)size_local % 0xfa09;
  }
  if (0xfc < number) {
    uVar1 = (ulong)(uint)size_local;
    pvVar6 = std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)((long)&size_local + 4),1);
    *pvVar6 = (char)(uVar1 / 0xfd) + '\x01';
    size_local._0_4_ = (uint)size_local % 0xfd;
  }
  cVar2 = (char)(uint)size_local;
  pvVar6 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)((long)&size_local + 4),0);
  *pvVar6 = cVar2 + '\x01';
  local_20 = 3;
  while( true ) {
    if (local_20 < 0) {
      aVar3._M_elems[0] = size_local._4_1_;
      aVar3._M_elems[1] = size_local._5_1_;
      aVar3._M_elems[2] = size_local._6_1_;
      aVar3._M_elems[3] = size_local._7_1_;
      return (array<unsigned_char,_4UL>)aVar3._M_elems;
    }
    if (local_20 == 0) break;
    pvVar6 = std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)((long)&size_local + 4),(long)local_20);
    if (*pvVar6 != '\0') {
      *size = (long)(local_20 + 1);
      aVar4._M_elems[0] = size_local._4_1_;
      aVar4._M_elems[1] = size_local._5_1_;
      aVar4._M_elems[2] = size_local._6_1_;
      aVar4._M_elems[3] = size_local._7_1_;
      return (array<unsigned_char,_4UL>)aVar4._M_elems;
    }
    local_20 = local_20 + -1;
  }
  *size = 1;
  aVar5._M_elems[0] = size_local._4_1_;
  aVar5._M_elems[1] = size_local._5_1_;
  aVar5._M_elems[2] = size_local._6_1_;
  aVar5._M_elems[3] = size_local._7_1_;
  return (array<unsigned_char,_4UL>)aVar5._M_elems;
}

Assistant:

std::array<unsigned char, 4> PacketProcessor::ENumber(unsigned int number, std::size_t &size)
{
	std::array<unsigned char, 4> bytes{{254, 254, 254, 254}};
	unsigned int onumber = number;

	if (onumber >= PacketProcessor::MAX3)
	{
		bytes[3] = number / PacketProcessor::MAX3 + 1;
		number = number % PacketProcessor::MAX3;
	}

	if (onumber >= PacketProcessor::MAX2)
	{
		bytes[2] = number / PacketProcessor::MAX2 + 1;
		number = number % PacketProcessor::MAX2;
	}

	if (onumber >= PacketProcessor::MAX1)
	{
		bytes[1] = number / PacketProcessor::MAX1 + 1;
		number = number % PacketProcessor::MAX1;
	}

	bytes[0] = number + 1;

	for (int i = 3; i >= 0; --i)
	{
		if (i == 0)
		{
			size = 1;
			break;
		}
		else if (bytes[i] > 0)
		{
			size = i + 1;
			break;
		}
	}

	return bytes;
}